

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerate.cpp
# Opt level: O3

void __thiscall
luna::CodeGenerateVisitor::Visit(CodeGenerateVisitor *this,ParamList *param_list,void *data)

{
  Function *this_00;
  SyntaxTree *pSVar1;
  NameListData_conflict name_list_data;
  
  this_00 = this->current_function_->function_;
  Function::AddFixedArgCount(this_00,(int)param_list->fix_arg_count_);
  if (param_list->vararg_ == true) {
    Function::SetHasVararg(this_00);
  }
  pSVar1 = (param_list->name_list_)._M_t.
           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  if (pSVar1 != (SyntaxTree *)0x0) {
    (*pSVar1->_vptr_SyntaxTree[2])(pSVar1,this);
  }
  return;
}

Assistant:

void CodeGenerateVisitor::Visit(ParamList *param_list, void *data)
    {
        auto function = GetCurrentFunction();
        function->AddFixedArgCount(param_list->fix_arg_count_);
        if (param_list->vararg_) function->SetHasVararg();

        if (param_list->name_list_)
        {
            NameListData name_list_data{ false };
            param_list->name_list_->Accept(this, &name_list_data);
        }
    }